

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.h
# Opt level: O0

HeapType __thiscall wasm::Type::getHeapType(Type *this)

{
  bool bVar1;
  HeapType local_20;
  Type *local_18;
  Type *this_local;
  HeapType masked;
  
  local_18 = this;
  bVar1 = isRef(this);
  if (!bVar1) {
    __assert_fail("isRef()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                  ,0x183,"HeapType wasm::Type::getHeapType() const");
  }
  HeapType::HeapType((HeapType *)&this_local,this->id & 0xfffffffffffffffd);
  bVar1 = HeapType::isBasic((HeapType *)&this_local);
  if (!bVar1) {
    HeapType::HeapType(&local_20,(ulong)this_local & 0xfffffffffffffffb);
    this_local = (Type *)local_20.id;
  }
  return (HeapType)(uintptr_t)this_local;
}

Assistant:

HeapType getHeapType() const {
    assert(isRef());
    HeapType masked(id & ~NullMask);
    // Avoid masking off the shared bit on basic heap types.
    if (!masked.isBasic()) {
      masked = HeapType(masked.id & ~ExactMask);
    }
    return masked;
  }